

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_t __thiscall llvm::StringRef::find(StringRef *this,StringRef Str,size_t From)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  ulong __n;
  size_t sVar9;
  char *__s2;
  char *__s1;
  size_t sStack_160;
  StringRef Str_local;
  uint8_t BadCharSkip [256];
  
  __n = Str.Length;
  __s2 = Str.Data;
  sVar2 = 0xffffffffffffffff;
  sVar9 = this->Length - From;
  sStack_160 = sVar2;
  if (((From <= this->Length) && (sStack_160 = From, __n != 0)) &&
     (sStack_160 = sVar2, __n <= sVar9)) {
    pcVar8 = this->Data;
    __s1 = pcVar8 + From;
    Str_local.Data = __s2;
    Str_local.Length = __n;
    if (__n == 1) {
      pvVar6 = memchr(__s1,(int)*__s2,sVar9);
      sStack_160 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)pcVar8;
    }
    else if (__n < 0x100 && 0xf < sVar9) {
      pcVar8 = __s1 + (sVar9 - __n) + 1;
      memset(BadCharSkip,(int)Str.Length,0x100);
      sVar9 = __n - 1;
      for (uVar5 = 0; sVar9 != uVar5; uVar5 = uVar5 + 1) {
        bVar3 = operator[](&Str_local,(ulong)uVar5);
        BadCharSkip[bVar3] = (char)sVar9 - (char)uVar5;
      }
      bVar3 = __s2[sVar9];
      sStack_160 = 0xffffffffffffffff;
      do {
        bVar1 = __s1[sVar9];
        if ((bVar1 == bVar3) && (iVar4 = bcmp(__s1,__s2,sVar9), iVar4 == 0)) {
          return (long)__s1 - (long)this->Data;
        }
        __s1 = __s1 + BadCharSkip[bVar1];
      } while (__s1 < pcVar8);
    }
    else {
      do {
        iVar4 = bcmp(pcVar8 + From,__s2,__n);
        if (iVar4 == 0) {
          return From;
        }
        pcVar7 = pcVar8 + From;
        From = From + 1;
      } while (pcVar7 < __s1 + (sVar9 - __n));
    }
  }
  return sStack_160;
}

Assistant:

size_t StringRef::find(StringRef Str, size_t From) const {
  if (From > Length)
    return npos;

  const char *Start = Data + From;
  size_t Size = Length - From;

  const char *Needle = Str.data();
  size_t N = Str.size();
  if (N == 0)
    return From;
  if (Size < N)
    return npos;
  if (N == 1) {
    const char *Ptr = (const char *)::memchr(Start, Needle[0], Size);
    return Ptr == nullptr ? npos : Ptr - Data;
  }

  const char *Stop = Start + (Size - N + 1);

  // For short haystacks or unsupported needles fall back to the naive algorithm
  if (Size < 16 || N > 255) {
    do {
      if (std::memcmp(Start, Needle, N) == 0)
        return Start - Data;
      ++Start;
    } while (Start < Stop);
    return npos;
  }

  // Build the bad char heuristic table, with uint8_t to reduce cache thrashing.
  uint8_t BadCharSkip[256];
  std::memset(BadCharSkip, N, 256);
  for (unsigned i = 0; i != N-1; ++i)
    BadCharSkip[(uint8_t)Str[i]] = N-1-i;

  do {
    uint8_t Last = Start[N - 1];
    if (LLVM_UNLIKELY(Last == (uint8_t)Needle[N - 1]))
      if (std::memcmp(Start, Needle, N - 1) == 0)
        return Start - Data;

    // Otherwise skip the appropriate number of bytes.
    Start += BadCharSkip[Last];
  } while (Start < Stop);

  return npos;
}